

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O0

int ly_utf8_and_equal(char *input,int bytes,...)

{
  uint *local_128;
  uint *local_110;
  uint local_f8 [47];
  int byte;
  int and;
  int i;
  va_list ap;
  int bytes_local;
  char *input_local;
  
  ap[0]._0_8_ = &stack0x00000008;
  and = 0x10;
  byte = 0;
  while( true ) {
    if (bytes <= byte) {
      return 1;
    }
    if ((uint)and < 0x29) {
      local_110 = (uint *)((long)local_f8 + (long)and);
      and = and + 8;
    }
    else {
      local_110 = (uint *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    if ((uint)and < 0x29) {
      local_128 = (uint *)((long)local_f8 + (long)and);
      and = and + 8;
    }
    else {
      local_128 = (uint *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    if (((uint)(byte)input[byte] & *local_110) != (*local_128 & 0xff)) break;
    byte = byte + 1;
  }
  return 0;
}

Assistant:

static int
ly_utf8_and_equal(const char *input, int bytes, ...)
{
    va_list ap;
    int i, and, byte;

    va_start(ap, bytes);
    for (i = 0; i < bytes; ++i) {
        and = va_arg(ap, int);
        byte = va_arg(ap, int);

        /* compare each byte */
        if (((uint8_t)input[i] & and) != (uint8_t)byte) {
            return 0;
        }
    }
    va_end(ap);

    return 1;
}